

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

BOOL macro_sub(List *ls,SymbolTable *sym,BOOL flag_failure)

{
  Token *original;
  TokenType TVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  HashErr HVar5;
  uint uVar6;
  int iVar7;
  BOOL BVar8;
  BOOL BVar9;
  int iVar10;
  List *pLVar11;
  char *pcVar12;
  ListStruct *pLVar13;
  char *fmt;
  SymbolInfo *val;
  uint uVar14;
  undefined8 *local_450;
  SymbolInfo info;
  char buf [1024];
  
  TVar1 = (ls->token).type;
  pLVar11 = ls;
  if (TVar1 == TOK_IDENTIFIER) {
LAB_00107fad:
    pcVar12 = (pLVar11->token).u.string;
    pLVar11 = (List *)0x0;
  }
  else if (TVar1 == TOK_LIST) {
    pLVar11 = ls->car;
    if (pLVar11 == (List *)0x0) {
      if (flag_failure == FALSE) {
        return FALSE;
      }
      pcVar12 = "Macro name is missing!\n";
      goto LAB_00108251;
    }
    if ((pLVar11->token).type == TOK_IDENTIFIER) goto LAB_00107fad;
    pcVar12 = (char *)0x0;
  }
  else {
    pcVar12 = (char *)0x0;
  }
  val = &info;
  HVar5 = lookup_symbol(sym,pcVar12,val,(char **)0x0);
  if (HVar5 == HASH_NOTFOUND) {
    if (flag_failure == FALSE) {
      return FALSE;
    }
    if (pcVar12 == (char *)0x0) {
      if (pLVar11 == (List *)0x0) {
        pcVar12 = "Unknown operator.\n";
LAB_00108251:
        parse_error(ls,pcVar12);
        return FALSE;
      }
      pcVar12 = unparse_token(&pLVar11->token,buf);
      fmt = "Unknown operator \"%s\"\n";
      ls = pLVar11;
    }
    else {
      fmt = "Unknown operator \"%s\".\n";
    }
  }
  else {
    original = &ls->token;
    local_450 = (undefined8 *)0x0;
    while (plVar2 = (long *)val->p, plVar2 != (long *)0x0) {
      lVar3 = *plVar2;
      if (original->type == *(TokenType *)(lVar3 + 0x10)) {
        if (original->type == TOK_IDENTIFIER) {
          BVar9 = (BOOL)(local_450 == (undefined8 *)0x0);
LAB_0010806f:
          if (BVar9 != FALSE) {
LAB_00108074:
            local_450 = (undefined8 *)*plVar2;
          }
        }
        else {
          uVar6 = list_length(ls->car);
          iVar7 = list_length(*(List **)(lVar3 + 8));
          pLVar11 = *(List **)(lVar3 + 8);
          BVar8 = has_tail(pLVar11);
          if ((BVar8 != FALSE || (int)uVar6 <= iVar7) && (uVar14 = iVar7 - BVar8, uVar14 <= uVar6))
          {
            pLVar13 = ls->car;
            do {
              pLVar13 = pLVar13->cdr;
              if ((pLVar13 == (ListStruct *)0x0) ||
                 (pLVar11 = pLVar11->cdr, pLVar11 == (ListStruct *)0x0)) {
                if (local_450 == (undefined8 *)0x0) goto LAB_00108074;
                iVar7 = count_literals((List *)**(undefined8 **)(lVar3 + 8));
                pLVar11 = (List *)local_450[1];
                iVar10 = count_literals(pLVar11->cdr);
                if (iVar7 == iVar10) {
                  BVar9 = has_tail(pLVar11);
                  iVar7 = list_length(pLVar11);
                  if (uVar14 == iVar7 - BVar9) {
                    if (BVar9 != BVar8) goto LAB_0010806f;
                    break;
                  }
                  bVar4 = iVar7 - BVar9 < uVar14;
                }
                else {
                  bVar4 = iVar10 < iVar7;
                }
                BVar9 = (BOOL)bVar4;
                goto LAB_0010806f;
              }
              TVar1 = (pLVar11->token).type;
            } while (((TVar1 == TOK_IDENTIFIER) || (TVar1 == TOK_TAIL)) ||
                    (BVar9 = tokens_equal(&pLVar13->token,&pLVar11->token), BVar9 != FALSE));
          }
        }
      }
      val = (SymbolInfo *)(plVar2 + 1);
    }
    if (local_450 != (undefined8 *)0x0) {
      pLVar11 = (List *)*local_450;
      if (original->type == TOK_LIST) {
        pLVar11 = copy_list(pLVar11);
        substitute_args(ls->car->cdr,*(List **)local_450[1],pLVar11);
      }
      else {
        if (pLVar11 == (List *)0x0) {
          original->type = TOK_EMPTY;
          return TRUE;
        }
        if ((pLVar11->cdr == (ListStruct *)0x0) &&
           (TVar1 = (pLVar11->token).type, TVar1 != TOK_LIST)) {
          (ls->token).type = TVar1;
          (ls->token).u = (pLVar11->token).u;
          return TRUE;
        }
        pLVar11 = copy_list(pLVar11);
        propagate_fileinfo(original,pLVar11);
      }
      replace_list(ls,pLVar11);
      return TRUE;
    }
    if (flag_failure == FALSE) {
      return FALSE;
    }
    fmt = "No applicable version of the \"%s\" macro exists for these arguments.\n";
  }
  parse_error(ls,fmt,pcVar12);
  return FALSE;
}

Assistant:

BOOL
macro_sub (List *ls, const SymbolTable *sym, BOOL flag_failure)
{
  const Macro *m;
  List *best = NULL, *new, *op;
  SymbolInfo info;
  const char *name;

#ifdef DEBUG
  printf ("macro_sub: "); print_list (ls, stdout); putchar ('\n');
#endif


  /* Get the name of the macro to be expanded. */
  op = NULL;
  if (ls->token.type == TOK_LIST)
    {
      if (ls->car == NULL)
	{
	  if (flag_failure)
	    parse_error (ls, "Macro name is missing!\n");
	  return FALSE;
	}
      if (ls->car->token.type == TOK_IDENTIFIER)
	name = ls->car->token.u.string;
      else
	{
	  op = ls->car;
	  name = NULL;
	}
    }
  else if (ls->token.type == TOK_IDENTIFIER)
    name = ls->token.u.string;
  else
    {
      op = ls;
      name = NULL;
    }

  /* Look up the macro list in the symbol table. */
  if (lookup_symbol (sym, name, &info, NULL) == HASH_NOTFOUND)
    {
      if (flag_failure)
	{
	  char buf[1024];
	  if (name == NULL)
	    {
	      if (op != NULL)
		parse_error (op, "Unknown operator \"%s\"\n",
			     unparse_token (&op->token, buf));
	      else
		parse_error (ls, "Unknown operator.\n");
	    }
	  else
	    parse_error (ls, "Unknown operator \"%s\".\n", name);
	}
      return FALSE;
    }
  m = (const Macro *) info.p;


  /* Now we have a list of macros and we have to choose the best match by the
   * following heuristics, in order:
   *  (1) Invocation form matching.  "foo" and "(foo)" can only match
   *      (define foo ...) and (define (foo) ...), respectively.
   *  (2) The number of arguments must match.  Note that the "+tail" construct
   *      can allow an arbitrarily high number of arguments.
   *  (3) All literals must match (see 3, below)
   *  (4) Number of literal matches.  For example, it is legal to both
   *      (define (foo a1 a2 0) x) and (define (foo a1 a2 a3) y).  In this
   *      example, an invocation of (foo 2 1 0) would expand to x.
   *  (5) Larger number of arguments.  Whichever macro names the most arguments
   *      (disregarding any "+tail", of course) will be preferred.
   *  (6) Prefer the macro without a "+tail".
   *  (7) Lexical predecence.  In case of a tie, the first macro defined will
   *      be chosen.
   */

  /* Find the best match. */
  for (best = NULL; m != NULL; m = m->next)
    if (better_match (ls, m->expr, best))
      best = m->expr;

  /* Was there no match at all? */
  if (best == NULL)
    {
      if (flag_failure)
	parse_error (ls, "No applicable version of the \"%s\" macro exists "
		     "for these arguments.\n", name);
      return FALSE;
    }

  /* Is this simple substitution (ie, no macro arguments, etc.) */
  if (ls->token.type != TOK_LIST)
    {
      if (best->cdr == NULL)  /* Empty list? */
	ls->token.type = TOK_EMPTY;
      else if (CDDR (best) == NULL && best->cdr->token.type != TOK_LIST)
	{
	  ls->token.type = best->cdr->token.type;
	  ls->token.u    = best->cdr->token.u;
	}
      else
	{
	  new = copy_list (best->cdr);
	  propagate_fileinfo (&ls->token, new);  /* So we don't forget... */
	  replace_list (ls, new);
	}

      return TRUE;
    }

  /* It's a complicate macro with arguments.  Substitute in the arguments. */
  new = copy_list (best->cdr);
  substitute_args (CDAR (ls), CDAR (best), new);
  replace_list (ls, new);

  return TRUE;
}